

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_add.c
# Opt level: O1

void crypto_sign_ed25519_ref10_fe_add(int32_t *h,int32_t *f,int32_t *g)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  
  iVar3 = f[1];
  iVar4 = f[2];
  iVar5 = f[3];
  iVar6 = f[4];
  iVar7 = f[5];
  iVar8 = f[6];
  iVar9 = f[7];
  iVar10 = g[1];
  iVar11 = g[2];
  iVar12 = g[3];
  iVar13 = g[4];
  iVar14 = g[5];
  iVar15 = g[6];
  iVar16 = g[7];
  uVar1 = *(undefined8 *)(f + 8);
  uVar2 = *(undefined8 *)(g + 8);
  *h = *g + *f;
  h[1] = iVar10 + iVar3;
  h[2] = iVar11 + iVar4;
  h[3] = iVar12 + iVar5;
  h[4] = iVar13 + iVar6;
  h[5] = iVar14 + iVar7;
  h[6] = iVar15 + iVar8;
  h[7] = iVar16 + iVar9;
  *(ulong *)(h + 8) =
       CONCAT44((int)((ulong)uVar2 >> 0x20) + (int)((ulong)uVar1 >> 0x20),(int)uVar2 + (int)uVar1);
  return;
}

Assistant:

void fe_add(fe h,const fe f,const fe g)
{
  crypto_int32 f0 = f[0];
  crypto_int32 f1 = f[1];
  crypto_int32 f2 = f[2];
  crypto_int32 f3 = f[3];
  crypto_int32 f4 = f[4];
  crypto_int32 f5 = f[5];
  crypto_int32 f6 = f[6];
  crypto_int32 f7 = f[7];
  crypto_int32 f8 = f[8];
  crypto_int32 f9 = f[9];
  crypto_int32 g0 = g[0];
  crypto_int32 g1 = g[1];
  crypto_int32 g2 = g[2];
  crypto_int32 g3 = g[3];
  crypto_int32 g4 = g[4];
  crypto_int32 g5 = g[5];
  crypto_int32 g6 = g[6];
  crypto_int32 g7 = g[7];
  crypto_int32 g8 = g[8];
  crypto_int32 g9 = g[9];
  crypto_int32 h0 = f0 + g0;
  crypto_int32 h1 = f1 + g1;
  crypto_int32 h2 = f2 + g2;
  crypto_int32 h3 = f3 + g3;
  crypto_int32 h4 = f4 + g4;
  crypto_int32 h5 = f5 + g5;
  crypto_int32 h6 = f6 + g6;
  crypto_int32 h7 = f7 + g7;
  crypto_int32 h8 = f8 + g8;
  crypto_int32 h9 = f9 + g9;
  h[0] = h0;
  h[1] = h1;
  h[2] = h2;
  h[3] = h3;
  h[4] = h4;
  h[5] = h5;
  h[6] = h6;
  h[7] = h7;
  h[8] = h8;
  h[9] = h9;
}